

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall leveldb::DBImpl::DoCompactionWork(DBImpl *this,CompactionState *compact)

{
  _func_int **pp_Var1;
  pointer pOVar2;
  CleanupFunction p_Var3;
  void *pvVar4;
  Logger *info_log;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  SnapshotImpl *pSVar9;
  uint64_t *puVar10;
  Iterator *pIVar11;
  long lVar12;
  long lVar13;
  undefined4 extraout_var;
  uint64_t uVar14;
  undefined4 extraout_var_00;
  _func_int *p_Var15;
  char *pcVar16;
  long *plVar17;
  Iterator *in_RDX;
  undefined8 extraout_RDX;
  Env *extraout_RDX_00;
  VersionSet *this_00;
  TableBuilder *pTVar18;
  ulong uVar19;
  ulong uVar20;
  DB DVar21;
  bool bVar22;
  CleanupFunction local_128;
  undefined1 local_118 [40];
  ParsedInternalKey ikey;
  string current_user_key;
  DB local_a0;
  LevelSummaryStorage tmp;
  
  lVar8 = (**(code **)(*(long *)compact->smallest_snapshot + 0xa8))();
  pp_Var1 = in_RDX->_vptr_Iterator;
  Log((Logger *)compact[1].smallest_snapshot,"Compacting %d@%d + %d@%d files",
      (ulong)((long)pp_Var1[0x19] - (long)pp_Var1[0x18]) >> 3,(ulong)*(uint *)pp_Var1,
      (ulong)((long)pp_Var1[0x1c] - (long)pp_Var1[0x1b]) >> 3);
  iVar7 = VersionSet::NumLevelFiles((VersionSet *)compact[8].outfile,*(int *)in_RDX->_vptr_Iterator)
  ;
  if (iVar7 < 1) {
    __assert_fail("versions_->NumLevelFiles(compact->compaction->level()) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x380,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  if (in_RDX[1].cleanup_head_.function != (CleanupFunction)0x0) {
    __assert_fail("compact->builder == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x381,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  if (in_RDX[1]._vptr_Iterator != (_func_int **)0x0) {
    __assert_fail("compact->outfile == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x382,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  if (compact[7].outputs.
      super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
      ._M_impl.super__Vector_impl_data._M_start == (pointer)(compact + 7)) {
    this_00 = (VersionSet *)compact[8].outfile;
    puVar10 = &this_00->last_sequence_;
  }
  else {
    pSVar9 = SnapshotList::oldest((SnapshotList *)(compact + 7));
    puVar10 = &pSVar9->sequence_number_;
    this_00 = (VersionSet *)compact[8].outfile;
  }
  (in_RDX->cleanup_head_).function = (CleanupFunction)*puVar10;
  pIVar11 = VersionSet::MakeInputIterator(this_00,(Compaction *)in_RDX->_vptr_Iterator);
  local_118._32_8_ = &compact[3].smallest_snapshot;
  pthread_mutex_unlock((pthread_mutex_t *)local_118._32_8_);
  (*pIVar11->_vptr_Iterator[3])(pIVar11);
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  ikey.user_key.data_ = "";
  ikey.user_key.size_ = 0;
  current_user_key._M_dataplus._M_p = (pointer)&current_user_key.field_2;
  current_user_key._M_string_length = 0;
  current_user_key.field_2._M_local_buf[0] = '\0';
  bVar22 = false;
  local_128 = (CleanupFunction)0xffffffffffffff;
  local_118._24_8_ = (Comparator *)0x0;
  while ((iVar7 = (*pIVar11->_vptr_Iterator[2])(pIVar11), (char)iVar7 != '\0' &&
         (((ulong)compact[3].builder & 1) == 0))) {
    if (((ulong)compact[5].compaction & 1) != 0) {
      lVar12 = (**(code **)(*(long *)compact->smallest_snapshot + 0xa8))();
      std::mutex::lock((mutex *)local_118._32_8_);
      if (compact[4].total_bytes != 0) {
        CompactMemTable((DBImpl *)compact);
        std::condition_variable::notify_all();
      }
      pthread_mutex_unlock((pthread_mutex_t *)local_118._32_8_);
      lVar13 = (**(code **)(*(long *)compact->smallest_snapshot + 0xa8))();
      local_118._24_8_ = local_118._24_8_ + (lVar13 - lVar12);
    }
    tmp.buffer._0_4_ = (*pIVar11->_vptr_Iterator[8])(pIVar11);
    tmp.buffer._4_4_ = extraout_var;
    tmp.buffer._8_8_ = extraout_RDX;
    bVar6 = Compaction::ShouldStopBefore((Compaction *)in_RDX->_vptr_Iterator,(Slice *)&tmp);
    if ((bVar6) && (in_RDX[1].cleanup_head_.function != (CleanupFunction)0x0)) {
      FinishCompactionOutputFile((DBImpl *)local_118,compact,in_RDX);
      uVar5 = local_118._0_8_;
      pp_Var1 = (this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)local_118._0_8_;
      local_118._0_8_ = pp_Var1;
      Status::~Status((Status *)local_118);
      if ((_func_int **)uVar5 != (_func_int **)0x0) goto LAB_00112364;
    }
    if ((ulong)tmp.buffer._8_8_ < 8) {
LAB_00112189:
      current_user_key._M_string_length = 0;
      *current_user_key._M_dataplus._M_p = '\0';
      bVar22 = false;
      local_128 = (CleanupFunction)0xffffffffffffff;
LAB_001121b2:
      pTVar18 = (TableBuilder *)in_RDX[1].cleanup_head_.function;
      if (pTVar18 == (TableBuilder *)0x0) {
        OpenCompactionOutputFile((DBImpl *)local_118,compact);
        uVar5 = local_118._0_8_;
        pp_Var1 = (this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)local_118._0_8_;
        local_118._0_8_ = pp_Var1;
        Status::~Status((Status *)local_118);
        if ((_func_int **)uVar5 != (_func_int **)0x0) goto LAB_00112364;
        pTVar18 = (TableBuilder *)in_RDX[1].cleanup_head_.function;
      }
      uVar14 = TableBuilder::NumEntries(pTVar18);
      if (uVar14 == 0) {
        InternalKey::DecodeFrom
                  ((InternalKey *)((long)(in_RDX->cleanup_head_).arg2 + -0x40),(Slice *)&tmp);
      }
      InternalKey::DecodeFrom
                ((InternalKey *)((long)(in_RDX->cleanup_head_).arg2 + -0x20),(Slice *)&tmp);
      pTVar18 = (TableBuilder *)in_RDX[1].cleanup_head_.function;
      iVar7 = (*pIVar11->_vptr_Iterator[9])(pIVar11);
      local_118._0_8_ = CONCAT44(extraout_var_00,iVar7);
      local_118._8_8_ = extraout_RDX_00;
      TableBuilder::Add(pTVar18,(Slice *)&tmp,(Slice *)local_118);
      p_Var15 = (_func_int *)
                TableBuilder::FileSize((TableBuilder *)in_RDX[1].cleanup_head_.function);
      if (in_RDX->_vptr_Iterator[1] <= p_Var15) {
        FinishCompactionOutputFile((DBImpl *)local_118,compact,in_RDX);
        uVar5 = local_118._0_8_;
        pp_Var1 = (this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)local_118._0_8_;
        local_118._0_8_ = pp_Var1;
        Status::~Status((Status *)local_118);
        if ((_func_int **)uVar5 != (_func_int **)0x0) goto LAB_00112364;
      }
    }
    else {
      uVar19 = *(ulong *)(tmp.buffer._0_8_ + -8 + tmp.buffer._8_8_);
      ikey.type = (ValueType)uVar19 & 0xff;
      ikey.sequence = uVar19 >> 8;
      ikey.user_key.size_ = tmp.buffer._8_8_ - 8;
      ikey.user_key.data_ = (char *)tmp.buffer._0_8_;
      if (kTypeValue < ikey.type) goto LAB_00112189;
      if (bVar22) {
        pOVar2 = (compact->outputs).
                 super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_118._0_8_ = current_user_key._M_dataplus._M_p;
        local_118._8_8_ = current_user_key._M_string_length;
        iVar7 = (**(code **)(pOVar2->number + 0x10))(pOVar2,&ikey,(DBImpl *)local_118);
        if (iVar7 != 0) goto LAB_0011213f;
      }
      else {
LAB_0011213f:
        std::__cxx11::string::assign((char *)&current_user_key,(ulong)ikey.user_key.data_);
        local_128 = (CleanupFunction)0xffffffffffffff;
      }
      p_Var3 = (in_RDX->cleanup_head_).function;
      if (p_Var3 < local_128) {
        if (p_Var3 < ikey.sequence || ikey.type != kTypeDeletion) {
          local_128 = (CleanupFunction)ikey.sequence;
          bVar22 = true;
        }
        else {
          bVar6 = Compaction::IsBaseLevelForKey((Compaction *)in_RDX->_vptr_Iterator,&ikey.user_key)
          ;
          bVar22 = true;
          local_128 = (CleanupFunction)ikey.sequence;
          if (bVar6) goto LAB_001122b1;
        }
        goto LAB_001121b2;
      }
      bVar22 = true;
      local_128 = (CleanupFunction)ikey.sequence;
    }
LAB_001122b1:
    (*pIVar11->_vptr_Iterator[6])(pIVar11);
  }
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    if (((ulong)compact[3].builder & 1) == 0) {
      DVar21._vptr_DB = (this->super_DB)._vptr_DB;
    }
    else {
      tmp.buffer._0_8_ = anon_var_dwarf_1b681;
      tmp.buffer[8] = '\x1d';
      tmp.buffer[9] = '\0';
      tmp.buffer[10] = '\0';
      tmp.buffer[0xb] = '\0';
      tmp.buffer[0xc] = '\0';
      tmp.buffer[0xd] = '\0';
      tmp.buffer[0xe] = '\0';
      tmp.buffer[0xf] = '\0';
      local_118._0_8_ = "";
      local_118._8_8_ = (Env *)0x0;
      Status::IOError((Status *)&local_a0,(Slice *)&tmp,(Slice *)local_118);
      DVar21._vptr_DB = local_a0._vptr_DB;
      pp_Var1 = (this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = local_a0._vptr_DB;
      local_a0._vptr_DB = pp_Var1;
      Status::~Status((Status *)&local_a0);
    }
    if (DVar21._vptr_DB != (_func_int **)0x0) goto LAB_00112364;
    if (in_RDX[1].cleanup_head_.function != (CleanupFunction)0x0) {
      FinishCompactionOutputFile((DBImpl *)&tmp,compact,in_RDX);
      uVar5 = tmp.buffer._0_8_;
      (this->super_DB)._vptr_DB = (_func_int **)tmp.buffer._0_8_;
      tmp.buffer[0] = '\0';
      tmp.buffer[1] = '\0';
      tmp.buffer[2] = '\0';
      tmp.buffer[3] = '\0';
      tmp.buffer[4] = '\0';
      tmp.buffer[5] = '\0';
      tmp.buffer[6] = '\0';
      tmp.buffer[7] = '\0';
      Status::~Status((Status *)&tmp);
      if (uVar5 != 0) goto LAB_00112364;
    }
    (*pIVar11->_vptr_Iterator[10])(&tmp);
    uVar5 = tmp.buffer._0_8_;
    (this->super_DB)._vptr_DB = (_func_int **)tmp.buffer._0_8_;
    tmp.buffer[0] = '\0';
    tmp.buffer[1] = '\0';
    tmp.buffer[2] = '\0';
    tmp.buffer[3] = '\0';
    tmp.buffer[4] = '\0';
    tmp.buffer[5] = '\0';
    tmp.buffer[6] = '\0';
    tmp.buffer[7] = '\0';
    Status::~Status((Status *)&tmp);
    bVar22 = uVar5 == 0;
  }
  else {
LAB_00112364:
    bVar22 = false;
  }
  (*pIVar11->_vptr_Iterator[1])(pIVar11);
  lVar12 = (**(code **)(*(long *)compact->smallest_snapshot + 0xa8))();
  local_118._0_8_ = lVar12 - ((long)(_func_int ***)local_118._24_8_ + lVar8);
  local_118._8_8_ = (Env *)0x0;
  for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
    p_Var15 = in_RDX->_vptr_Iterator[lVar8 * 3 + 0x18];
    uVar19 = (ulong)((long)in_RDX->_vptr_Iterator[lVar8 * 3 + 0x19] - (long)p_Var15) >> 3;
    uVar20 = uVar19 & 0xffffffff;
    if ((int)uVar19 < 1) {
      uVar20 = 0;
    }
    for (uVar19 = 0; uVar20 != uVar19; uVar19 = uVar19 + 1) {
      local_118._8_8_ =
           (long)&((Env *)local_118._8_8_)->_vptr_Env +
           *(long *)(*(long *)(p_Var15 + uVar19 * 8) + 0x10);
    }
  }
  pvVar4 = (in_RDX->cleanup_head_).arg1;
  lVar8 = ((long)(in_RDX->cleanup_head_).arg2 - (long)pvVar4) / 0x50;
  plVar17 = (long *)((long)pvVar4 + 8);
  local_118._16_8_ = (_func_int **)0x0;
  while (bVar6 = lVar8 != 0, lVar8 = lVar8 + -1, bVar6) {
    local_118._16_8_ = local_118._16_8_ + *plVar17;
    plVar17 = plVar17 + 10;
  }
  std::mutex::lock((mutex *)local_118._32_8_);
  CompactionStats::Add
            ((CompactionStats *)(&compact[9].outputs + *(int *)in_RDX->_vptr_Iterator),
             (CompactionStats *)local_118);
  if (bVar22) {
    InstallCompactionResults((DBImpl *)&tmp,compact);
    uVar5 = tmp.buffer._0_8_;
    (this->super_DB)._vptr_DB = (_func_int **)tmp.buffer._0_8_;
    tmp.buffer[0] = '\0';
    tmp.buffer[1] = '\0';
    tmp.buffer[2] = '\0';
    tmp.buffer[3] = '\0';
    tmp.buffer[4] = '\0';
    tmp.buffer[5] = '\0';
    tmp.buffer[6] = '\0';
    tmp.buffer[7] = '\0';
    Status::~Status((Status *)&tmp);
    if (uVar5 == 0) goto LAB_00112479;
  }
  RecordBackgroundError((DBImpl *)compact,(Status *)this);
LAB_00112479:
  info_log = (Logger *)compact[1].smallest_snapshot;
  pcVar16 = VersionSet::LevelSummary((VersionSet *)compact[8].outfile,&tmp);
  Log(info_log,"compacted to: %s",pcVar16);
  std::__cxx11::string::_M_dispose();
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::DoCompactionWork(CompactionState* compact) {
  const uint64_t start_micros = env_->NowMicros();
  int64_t imm_micros = 0;  // Micros spent doing imm_ compactions

  Log(options_.info_log, "Compacting %d@%d + %d@%d files",
      compact->compaction->num_input_files(0), compact->compaction->level(),
      compact->compaction->num_input_files(1),
      compact->compaction->level() + 1);

  assert(versions_->NumLevelFiles(compact->compaction->level()) > 0);
  assert(compact->builder == nullptr);
  assert(compact->outfile == nullptr);
  if (snapshots_.empty()) {
    compact->smallest_snapshot = versions_->LastSequence();
  } else {
    compact->smallest_snapshot = snapshots_.oldest()->sequence_number();
  }

  Iterator* input = versions_->MakeInputIterator(compact->compaction);

  // Release mutex while we're actually doing the compaction work
  mutex_.Unlock();

  input->SeekToFirst();
  Status status;
  ParsedInternalKey ikey;
  std::string current_user_key;
  bool has_current_user_key = false;
  SequenceNumber last_sequence_for_key = kMaxSequenceNumber;
  while (input->Valid() && !shutting_down_.load(std::memory_order_acquire)) {
    // Prioritize immutable compaction work
    if (has_imm_.load(std::memory_order_relaxed)) {
      const uint64_t imm_start = env_->NowMicros();
      mutex_.Lock();
      if (imm_ != nullptr) {
        CompactMemTable();
        // Wake up MakeRoomForWrite() if necessary.
        background_work_finished_signal_.SignalAll();
      }
      mutex_.Unlock();
      imm_micros += (env_->NowMicros() - imm_start);
    }

    Slice key = input->key();
    if (compact->compaction->ShouldStopBefore(key) &&
        compact->builder != nullptr) {
      status = FinishCompactionOutputFile(compact, input);
      if (!status.ok()) {
        break;
      }
    }

    // Handle key/value, add to state, etc.
    bool drop = false;
    if (!ParseInternalKey(key, &ikey)) {
      // Do not hide error keys
      current_user_key.clear();
      has_current_user_key = false;
      last_sequence_for_key = kMaxSequenceNumber;
    } else {
      if (!has_current_user_key ||
          user_comparator()->Compare(ikey.user_key, Slice(current_user_key)) !=
              0) {
        // First occurrence of this user key
        current_user_key.assign(ikey.user_key.data(), ikey.user_key.size());
        has_current_user_key = true;
        last_sequence_for_key = kMaxSequenceNumber;
      }

      if (last_sequence_for_key <= compact->smallest_snapshot) {
        // Hidden by an newer entry for same user key
        drop = true;  // (A)
      } else if (ikey.type == kTypeDeletion &&
                 ikey.sequence <= compact->smallest_snapshot &&
                 compact->compaction->IsBaseLevelForKey(ikey.user_key)) {
        // For this user key:
        // (1) there is no data in higher levels
        // (2) data in lower levels will have larger sequence numbers
        // (3) data in layers that are being compacted here and have
        //     smaller sequence numbers will be dropped in the next
        //     few iterations of this loop (by rule (A) above).
        // Therefore this deletion marker is obsolete and can be dropped.
        drop = true;
      }

      last_sequence_for_key = ikey.sequence;
    }
#if 0
    Log(options_.info_log,
        "  Compact: %s, seq %d, type: %d %d, drop: %d, is_base: %d, "
        "%d smallest_snapshot: %d",
        ikey.user_key.ToString().c_str(),
        (int)ikey.sequence, ikey.type, kTypeValue, drop,
        compact->compaction->IsBaseLevelForKey(ikey.user_key),
        (int)last_sequence_for_key, (int)compact->smallest_snapshot);
#endif

    if (!drop) {
      // Open output file if necessary
      if (compact->builder == nullptr) {
        status = OpenCompactionOutputFile(compact);
        if (!status.ok()) {
          break;
        }
      }
      if (compact->builder->NumEntries() == 0) {
        compact->current_output()->smallest.DecodeFrom(key);
      }
      compact->current_output()->largest.DecodeFrom(key);
      compact->builder->Add(key, input->value());

      // Close output file if it is big enough
      if (compact->builder->FileSize() >=
          compact->compaction->MaxOutputFileSize()) {
        status = FinishCompactionOutputFile(compact, input);
        if (!status.ok()) {
          break;
        }
      }
    }

    input->Next();
  }

  if (status.ok() && shutting_down_.load(std::memory_order_acquire)) {
    status = Status::IOError("Deleting DB during compaction");
  }
  if (status.ok() && compact->builder != nullptr) {
    status = FinishCompactionOutputFile(compact, input);
  }
  if (status.ok()) {
    status = input->status();
  }
  delete input;
  input = nullptr;

  CompactionStats stats;
  stats.micros = env_->NowMicros() - start_micros - imm_micros;
  for (int which = 0; which < 2; which++) {
    for (int i = 0; i < compact->compaction->num_input_files(which); i++) {
      stats.bytes_read += compact->compaction->input(which, i)->file_size;
    }
  }
  for (size_t i = 0; i < compact->outputs.size(); i++) {
    stats.bytes_written += compact->outputs[i].file_size;
  }

  mutex_.Lock();
  stats_[compact->compaction->level() + 1].Add(stats);

  if (status.ok()) {
    status = InstallCompactionResults(compact);
  }
  if (!status.ok()) {
    RecordBackgroundError(status);
  }
  VersionSet::LevelSummaryStorage tmp;
  Log(options_.info_log, "compacted to: %s", versions_->LevelSummary(&tmp));
  return status;
}